

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getenv.c
# Opt level: O0

char * GetEnv(char *variable)

{
  char *pcVar1;
  char *local_20;
  char *env;
  char *variable_local;
  
  pcVar1 = getenv(variable);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = (*Curl_cstrdup)(pcVar1);
  }
  return local_20;
}

Assistant:

static
char *GetEnv(const char *variable)
{
#if defined(_WIN32_WCE) || defined(CURL_WINDOWS_APP)
  (void)variable;
  return NULL;
#else
#ifdef WIN32
  char env[MAX_PATH]; /* MAX_PATH is from windef.h */
  char *temp = getenv(variable);
  env[0] = '\0';
  if(temp != NULL)
    ExpandEnvironmentStringsA(temp, env, sizeof(env));
  return (env[0] != '\0')?strdup(env):NULL;
#else
  char *env = getenv(variable);
  return (env && env[0])?strdup(env):NULL;
#endif
#endif
}